

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

function<int_()> * __thiscall
cmake::BuildWorkflowStep
          (function<int_()> *__return_storage_ptr__,cmake *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmUVProcessChainBuilder *pcVar1;
  cmUVProcessChainBuilder local_90;
  undefined1 local_50 [8];
  cmUVProcessChainBuilder builder;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  builder.Processes.
  super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)args;
  cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_50);
  pcVar1 = cmUVProcessChainBuilder::AddCommand
                     ((cmUVProcessChainBuilder *)local_50,
                      &(builder.Processes.
                        super__Vector_base<cmUVProcessChainBuilder::ProcessConfiguration,_std::allocator<cmUVProcessChainBuilder::ProcessConfiguration>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage)->Arguments);
  pcVar1 = cmUVProcessChainBuilder::SetExternalStream(pcVar1,Stream_OUTPUT,1);
  cmUVProcessChainBuilder::SetExternalStream(pcVar1,Stream_ERROR,2);
  cmUVProcessChainBuilder::cmUVProcessChainBuilder(&local_90,(cmUVProcessChainBuilder *)local_50);
  std::function<int()>::
  function<cmake::BuildWorkflowStep(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0,void>
            ((function<int()> *)__return_storage_ptr__,(anon_class_48_1_911e227b *)&local_90);
  BuildWorkflowStep(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::
  $_0::~__0((__0 *)&local_90);
  cmUVProcessChainBuilder::~cmUVProcessChainBuilder((cmUVProcessChainBuilder *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::function<int()> cmake::BuildWorkflowStep(
  const std::vector<std::string>& args)
{
  cmUVProcessChainBuilder builder;
  builder
    .AddCommand(args)
#  ifdef _WIN32
    .SetExternalStream(cmUVProcessChainBuilder::Stream_OUTPUT, _fileno(stdout))
    .SetExternalStream(cmUVProcessChainBuilder::Stream_ERROR, _fileno(stderr));
#  else
    .SetExternalStream(cmUVProcessChainBuilder::Stream_OUTPUT, STDOUT_FILENO)
    .SetExternalStream(cmUVProcessChainBuilder::Stream_ERROR, STDERR_FILENO);
#  endif
  return [builder]() -> int {
    auto chain = builder.Start();
    chain.Wait();
    return static_cast<int>(chain.GetStatus().front()->ExitStatus);
  };
}